

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void NV21ToARGBRow_AVX2(uint8_t *y_buf,uint8_t *vu_buf,uint8_t *dst_argb,YuvConstants *yuvconstants,
                       int width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  bool bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 in_ZMM5 [64];
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8_t *dst_argb_local;
  uint8_t *vu_buf_local;
  uint8_t *y_buf_local;
  
  auVar2 = *(undefined1 (*) [32])yuvconstants->kUVToB;
  auVar3 = *(undefined1 (*) [32])yuvconstants->kUVToG;
  auVar4 = *(undefined1 (*) [32])yuvconstants->kUVToR;
  auVar5 = *(undefined1 (*) [32])yuvconstants->kUVBiasB;
  auVar6 = *(undefined1 (*) [32])yuvconstants->kUVBiasG;
  auVar7 = *(undefined1 (*) [32])yuvconstants->kUVBiasR;
  auVar8 = *(undefined1 (*) [32])yuvconstants->kYToRgb;
  auVar10 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  do {
    auVar1 = *(undefined1 (*) [16])vu_buf;
    vu_buf = (uint8_t *)((long)vu_buf + 0x10);
    auVar14 = vpermq_avx2(ZEXT1632(auVar1),0xd8);
    auVar16 = vpshufb_avx2(auVar14,(undefined1  [32])libyuv::kShuffleNV21);
    auVar14 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])y_buf),0xd8);
    auVar12 = vpunpcklbw_avx2(auVar14,auVar14);
    y_buf = (uint8_t *)((long)y_buf + 0x10);
    auVar14 = vpmaddubsw_avx2(auVar16,auVar4);
    auVar15 = vpmaddubsw_avx2(auVar16,auVar3);
    auVar16 = vpmaddubsw_avx2(auVar16,auVar2);
    auVar11 = vpsubw_avx2(auVar7,auVar14);
    auVar15 = vpsubw_avx2(auVar6,auVar15);
    auVar14 = vpsubw_avx2(auVar5,auVar16);
    auVar16 = vpmulhuw_avx2(auVar8,auVar12);
    auVar14 = vpaddsw_avx2(auVar14,auVar16);
    auVar15 = vpaddsw_avx2(auVar15,auVar16);
    auVar16 = vpaddsw_avx2(auVar11,auVar16);
    auVar14 = vpsraw_avx2(auVar14,6);
    auVar15 = vpsraw_avx2(auVar15,6);
    auVar16 = vpsraw_avx2(auVar16,6);
    auVar14 = vpackuswb_avx2(auVar14,auVar14);
    auVar15 = vpackuswb_avx2(auVar15,auVar15);
    auVar16 = vpackuswb_avx2(auVar16,auVar16);
    auVar14 = vpunpcklbw_avx2(auVar14,auVar15);
    auVar11 = vpermq_avx2(auVar14,0xd8);
    auVar14 = vpunpcklbw_avx2(auVar16,auVar10);
    auVar14 = vpermq_avx2(auVar14,0xd8);
    auVar15 = vpunpcklwd_avx2(auVar11,auVar14);
    auVar14 = vpunpckhwd_avx2(auVar11,auVar14);
    *(undefined1 (*) [32])dst_argb = auVar15;
    *(undefined1 (*) [32])((long)dst_argb + 0x20) = auVar14;
    dst_argb = (uint8_t *)((long)dst_argb + 0x40);
    iVar13 = width + -0x10;
    bVar9 = 0xf < width;
    width = iVar13;
  } while (iVar13 != 0 && bVar9);
  return;
}

Assistant:

void OMITFP NV21ToARGBRow_AVX2(const uint8_t* y_buf,
                               const uint8_t* vu_buf,
                               uint8_t* dst_argb,
                               const struct YuvConstants* yuvconstants,
                               int width) {
  // clang-format off
  asm volatile (
    YUVTORGB_SETUP_AVX2(yuvconstants)
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"

    LABELALIGN
      "1:                                        \n"
    READNV21_AVX2
    YUVTORGB_AVX2(yuvconstants)
    STOREARGB_AVX2
      "sub         $0x10,%[width]                \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [vu_buf]"+r"(vu_buf),    // %[vu_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants), // %[yuvconstants]
    [kShuffleNV21]"m"(kShuffleNV21)
    : "memory", "cc", YUVTORGB_REGS_AVX2
      "xmm0", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
  // clang-format on
}